

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall
notch::io::PlainTextNetworkReader::read_weights
          (PlainTextNetworkReader *this,istream *in,Array *w,Array *bias)

{
  ulong uVar1;
  ulong uVar2;
  istream *piVar3;
  size_t row;
  ulong uVar4;
  size_t col;
  ulong uVar5;
  
  uVar1 = w->_M_size;
  uVar2 = bias->_M_size;
  for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    piVar3 = std::ws<char,std::char_traits<char>>(in);
    std::istream::_M_extract<float>((float *)piVar3);
    for (uVar5 = 0; uVar5 < uVar1 / uVar2; uVar5 = uVar5 + 1) {
      piVar3 = std::ws<char,std::char_traits<char>>(in);
      std::istream::_M_extract<float>((float *)piVar3);
    }
  }
  return;
}

Assistant:

void read_weights(std::istream &in, Array &w, Array &bias) {
        size_t nInputs = w.size() / bias.size();
        size_t nOutputs = bias.size();
        for (size_t row = 0; row < nOutputs; ++row) {
            in >> std::ws >> bias[row];
            for (size_t col = 0; col < nInputs; ++col) {
                in >> std::ws >> w[row*nInputs + col];
            }
        }
    }